

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_LittleFourWinds_Test::
~TEST_DoublingFactorCounterTest_LittleFourWinds_Test
          (TEST_DoublingFactorCounterTest_LittleFourWinds_Test *this)

{
  TEST_DoublingFactorCounterTest_LittleFourWinds_Test *mem;
  TEST_DoublingFactorCounterTest_LittleFourWinds_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_LittleFourWinds_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, LittleFourWinds)
{
	addPair(Tile::EastWind);
	addTriplet(Tile::SouthWind, false);
	addTriplet(Tile::WestWind, false);
	addTriplet(Tile::NorthWind, false);
	addSequence(Tile::TwoOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::LittleFourWinds));
	CHECK_EQUAL(100, r.doubling_factor);
}